

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

Result __thiscall
tonk::UDPSocket::Initialize
          (UDPSocket *this,Dependencies *deps,IPVersion bindIPVersion,uint16_t port,
          TonkSocketConfig *socketConfig,TonkSocket apiTonkSocket,
          shared_ptr<asio::io_context::strand> *asioConnectStrand)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar4;
  char *pcVar5;
  uint8_t *puVar6;
  int in_ECX;
  ErrorResult *pEVar7;
  long in_RSI;
  ErrorResult *in_RDI;
  long in_R9;
  undefined1 uVar8;
  undefined8 in_stack_00000008;
  uint8_t *readBuffer;
  UDPAddress local_ep;
  udp internet_protocol;
  address bindAddr;
  UDPAddress bindAddress;
  error_code ec;
  Result *result;
  Locker locker;
  LogStringBuffer buffer;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  undefined6 in_stack_fffffffffffff790;
  unsigned_short in_stack_fffffffffffff796;
  undefined4 in_stack_fffffffffffff798;
  ErrorType in_stack_fffffffffffff79c;
  PCGRandom *in_stack_fffffffffffff7a0;
  error_code *in_stack_fffffffffffff7a8;
  LogStringBuffer *pLVar9;
  ErrorResult *in_stack_fffffffffffff7b0;
  io_context *in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff7c8;
  uint bytes;
  LogStringBuffer *buffer_00;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  uint8_t *in_stack_fffffffffffff7d8;
  UDPSocket *in_stack_fffffffffffff7e0;
  uint in_stack_fffffffffffff7e8;
  uint in_stack_fffffffffffff7ec;
  FloodDetector *in_stack_fffffffffffff7f0;
  UDPSocket *in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff8c8;
  char **ppcVar10;
  socket *in_stack_fffffffffffff8d0;
  string local_6e8 [80];
  char *local_698;
  uint8_t *local_690;
  string local_688 [32];
  undefined8 local_668 [5];
  string local_640 [32];
  undefined8 local_620;
  int local_618;
  char *local_608;
  string local_600 [32];
  undefined8 local_5e0;
  int local_5d8;
  int local_5c8 [8];
  int local_5a8;
  string local_588 [32];
  char *local_568 [5];
  undefined1 local_53c [28];
  error_code local_520;
  char *local_510 [4];
  char *local_4f0;
  undefined1 local_4e1;
  long local_4e0;
  int local_4d4;
  char **local_4a0;
  undefined8 *local_490;
  undefined8 *local_480;
  char **local_470;
  undefined8 *local_460;
  char **local_450;
  char **local_440;
  char **local_430;
  long local_3f8;
  undefined4 local_3ec;
  string *local_3e8;
  char *local_3e0;
  char **local_3d8;
  long local_3c0;
  undefined4 local_3b4;
  string *local_3b0;
  char *local_3a8;
  undefined8 *local_3a0;
  long local_388;
  undefined4 local_37c;
  string *local_378;
  char *local_370;
  undefined8 *local_368;
  long local_350;
  undefined4 local_344;
  string *local_340;
  char *local_338;
  undefined8 *local_330;
  undefined4 local_2d4;
  undefined8 local_2d0;
  long local_2c8;
  string *local_2c0;
  char *local_2b8;
  LogStringBuffer *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  string *local_80;
  char *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  LogStringBuffer *local_28;
  string *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  bytes = (uint)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  local_4e0 = in_R9;
  local_4d4 = in_ECX;
  Dependencies::operator=
            ((Dependencies *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
             (Dependencies *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
  *(long *)(in_RSI + 200) = local_4e0;
  *(undefined8 *)(in_RSI + 0xd0) = in_stack_00000008;
  std::shared_ptr<asio::io_context::strand>::operator=
            ((shared_ptr<asio::io_context::strand> *)
             CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
             (shared_ptr<asio::io_context::strand> *)
             CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
             (bool)in_stack_fffffffffffff78f);
  siamese::GetTimeUsec();
  siamese::PCGRandom::Seed
            (in_stack_fffffffffffff7a0,CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798)
             ,CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
  local_4e1 = 0;
  in_RDI->Source = (char *)0x0;
  FloodDetector::Initialize
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8);
  local_430 = &local_4f0;
  in_RDI->Source = local_4f0;
  local_4f0 = (char *)0x0;
  Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
  if (in_RDI->Source == (char *)0x0) {
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
    MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
              (in_stack_fffffffffffff7b8);
    std::
    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::operator=((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
                (unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
    std::
    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   *)in_stack_fffffffffffff7a0);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                        *)0x1f7d9b);
    if (bVar1) {
      std::error_code::error_code
                ((error_code *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)0x1f7e1f);
      if (*(long *)(local_4e0 + 0x40) == 0) {
        if (local_4d4 == 1) {
          local_5a8 = (int)asio::ip::udp::v4();
        }
        else {
          local_5a8 = (int)asio::ip::udp::v6();
        }
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff7a0,
                   (udp *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff796);
        asio::ip::basic_endpoint<asio::ip::udp>::operator=
                  ((basic_endpoint<asio::ip::udp> *)
                   CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
                   (basic_endpoint<asio::ip::udp> *)
                   CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
      }
      else {
        asio::ip::make_address
                  ((char *)in_stack_fffffffffffff7b8,(error_code *)in_stack_fffffffffffff7b0);
        bVar1 = std::error_code::operator_cast_to_bool(&local_520);
        if (bVar1) {
          std::error_code::message_abi_cxx11_(in_stack_fffffffffffff7a8);
          iVar3 = std::error_code::value(&local_520);
          local_3f8 = (long)iVar3;
          ppcVar10 = local_568;
          local_3e0 = "Provided InterfaceAddress was invalid";
          local_3e8 = local_588;
          local_3ec = 2;
          local_3d8 = ppcVar10;
          pcVar5 = (char *)operator_new(0x38);
          ErrorResult::ErrorResult
                    (in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                     (string *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                     CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
          *ppcVar10 = pcVar5;
          local_450 = local_568;
          in_RDI->Source = local_568[0];
          local_568[0] = (char *)0x0;
          Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
          std::__cxx11::string::~string(local_588);
          goto LAB_001f8b13;
        }
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)
                   CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
                   (address *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),0);
        asio::ip::basic_endpoint<asio::ip::udp>::operator=
                  ((basic_endpoint<asio::ip::udp> *)
                   CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
                   (basic_endpoint<asio::ip::udp> *)
                   CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
      }
      pbVar4 = &std::
                unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                              *)0x1f80f0)->
                super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
      local_5c8[0] = (int)asio::ip::basic_endpoint<asio::ip::udp>::protocol
                                    ((basic_endpoint<asio::ip::udp> *)
                                     CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
      local_5d8 = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
                  open(pbVar4,(char *)local_5c8,(int)&local_520);
      bVar1 = std::error_code::operator_cast_to_bool(&local_520);
      if (bVar1) {
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffff7a8);
        iVar3 = std::error_code::value(&local_520);
        local_3c0 = (long)iVar3;
        local_3a0 = &local_5e0;
        local_3a8 = "UDP socket open failed";
        local_3b0 = local_600;
        local_3b4 = 2;
        pcVar5 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                   (string *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                   CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
        local_460 = &local_5e0;
        in_RDI->Source = pcVar5;
        local_5e0 = 0;
        Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
        std::__cxx11::string::~string(local_600);
      }
      else {
        std::
        unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
        ::operator*((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
        SetUDPSocketOptions(in_stack_fffffffffffff8d0,
                            (uint)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                            (uint)in_stack_fffffffffffff8c8);
        local_470 = &local_608;
        in_RDI->Source = local_608;
        local_608 = (char *)0x0;
        Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
        if (in_RDI->Source == (char *)0x0) {
          pEVar7 = in_RDI;
          pbVar4 = &std::
                    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                    ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                                  *)0x1f841b)->
                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
          ;
          local_618 = asio::
                      basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
                      bind(pbVar4,(int)local_53c,(sockaddr *)&local_520,(socklen_t)pEVar7);
          bVar1 = std::error_code::operator_cast_to_bool(&local_520);
          if (bVar1) {
            std::error_code::message_abi_cxx11_(in_stack_fffffffffffff7a8);
            iVar3 = std::error_code::value(&local_520);
            local_388 = (long)iVar3;
            local_368 = &local_620;
            local_370 = "UDP socket bind failed";
            local_378 = local_640;
            local_37c = 2;
            pcVar5 = (char *)operator_new(0x38);
            ErrorResult::ErrorResult
                      (in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                       (string *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                       CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
            local_480 = &local_620;
            in_RDI->Source = pcVar5;
            local_620 = 0;
            Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790))
            ;
            std::__cxx11::string::~string(local_640);
          }
          else {
            std::
            unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
            ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          *)0x1f8647);
            asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
            local_endpoint((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                            *)in_stack_fffffffffffff7a8,(error_code *)in_stack_fffffffffffff7a0);
            bVar1 = std::error_code::operator_cast_to_bool(&local_520);
            if (bVar1) {
              std::error_code::message_abi_cxx11_(in_stack_fffffffffffff7a8);
              iVar3 = std::error_code::value(&local_520);
              local_350 = (long)iVar3;
              local_330 = local_668;
              local_338 = "local_endpoint failed";
              local_340 = local_688;
              local_344 = 2;
              pcVar5 = (char *)operator_new(0x38);
              ErrorResult::ErrorResult
                        (in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,
                         (string *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                         CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
              local_490 = local_668;
              in_RDI->Source = pcVar5;
              local_668[0] = 0;
              Result::~Result((Result *)
                              CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
              std::__cxx11::string::~string(local_688);
            }
            else {
              uVar2 = asio::ip::basic_endpoint<asio::ip::udp>::port
                                ((basic_endpoint<asio::ip::udp> *)0x1f883f);
              *(unsigned_short *)(in_RSI + 0x198) = uVar2;
              local_2d0 = *(undefined8 *)(in_RSI + 0x80);
              local_2d4 = 0x546;
              Locker::Locker((Locker *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790)
                             ,(Lock *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788))
              ;
              puVar6 = pktalloc::Allocator::Allocate
                                 ((Allocator *)
                                  CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                                  bytes);
              Locker::~Locker((Locker *)0x1f8909);
              local_690 = puVar6;
              if (puVar6 == (uint8_t *)0x0) {
                Result::OutOfMemory();
                local_4a0 = &local_698;
                in_RDI->Source = local_698;
                local_698 = (char *)0x0;
                Result::~Result((Result *)
                                CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
              }
              else {
                local_2c8 = *(long *)(in_RSI + 0x88);
                std::__atomic_base<int>::operator++((__atomic_base<int> *)(local_2c8 + 0x28));
                postNextRead(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
              }
            }
          }
        }
      }
    }
    else {
      Result::OutOfMemory();
      local_440 = local_510;
      in_RDI->Source = local_510[0];
      local_510[0] = (char *)0x0;
      Result::~Result((Result *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790));
    }
  }
LAB_001f8b13:
  uVar8 = in_RDI->Source != (char *)0x0;
  if ((bool)uVar8) {
    pLVar9 = *(LogStringBuffer **)(in_RSI + 0x90);
    Result::ToJson_abi_cxx11_((Result *)in_stack_fffffffffffff7b8);
    local_2b8 = "UDPSocket::Initialize failed: ";
    local_2c0 = local_6e8;
    local_294 = 4;
    local_2a0 = "UDPSocket::Initialize failed: ";
    local_284 = 4;
    local_2b0 = pLVar9;
    local_2a8 = local_2c0;
    local_290 = pLVar9;
    local_280 = pLVar9;
    if ((int)pLVar9->LogLevel < 5) {
      local_cc = 4;
      local_d8 = "UDPSocket::Initialize failed: ";
      buffer_00 = pLVar9;
      local_e0 = local_2c0;
      local_c8 = pLVar9;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)CONCAT26(in_stack_fffffffffffff796,in_stack_fffffffffffff790),
                 (char *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),Trace);
      local_b0 = &pLVar9->field_0x38;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_a0 = pLVar9;
      local_98 = local_b0;
      local_90 = local_a8;
      local_88 = pLVar9;
      local_60 = local_b0;
      local_58 = local_a8;
      std::operator<<(aoStack_258,(string *)local_b0);
      local_70 = local_a8;
      local_78 = local_b8;
      local_80 = local_c0;
      local_48 = local_a8;
      local_50 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      local_68 = pLVar9;
      local_40 = pLVar9;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_30 = local_70;
      local_38 = local_80;
      local_18 = local_70;
      local_20 = local_80;
      local_28 = pLVar9;
      std::operator<<((ostream *)(local_70 + 0x10),local_80);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT17(uVar8,in_stack_fffffffffffff7d0),buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1f8ebc);
    }
    std::__cxx11::string::~string(local_6e8);
    CloseSocket(in_stack_fffffffffffff820);
  }
  return (Result)in_RDI;
}

Assistant:

Result UDPSocket::Initialize(
    const Dependencies& deps,
    IPVersion bindIPVersion,
    uint16_t port,
    const TonkSocketConfig* socketConfig,
    TonkSocket apiTonkSocket,
    std::shared_ptr<asio::io_context::strand> asioConnectStrand)
{
    Deps = deps;
    SocketConfig = socketConfig;
    APITonkSocket = apiTonkSocket;
    AsioConnectStrand = asioConnectStrand;
    TONK_DEBUG_ASSERT(asioConnectStrand != nullptr);
    SocketClosed = false;

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
#ifdef TONK_DEFAULT_ARTIFICIAL_PACKETLOSS
    SetArtificialPacketloss(TONK_DEFAULT_ARTIFICIAL_PACKETLOSS);
#endif
    ArtificialPacketlossPRNG.Seed(siamese::GetTimeUsec());
#endif

    Result result;

    try
    {
        result = FloodDetect.Initialize(
            socketConfig->MaximumClientsPerIP,
            socketConfig->MinuteFloodThresh
        );
        if (result.IsFail()) {
            goto OnError;
        }

        // Create a UDP socket for the connection attempt
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Deps.Context);
        if (!Socket)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        asio::error_code ec;

        // If application specified an interface address:
        UDPAddress bindAddress;
        if (socketConfig->InterfaceAddress)
        {
            // Convert provided interface address to Asio address
            asio::ip::address bindAddr = asio::ip::make_address(socketConfig->InterfaceAddress, ec);
            if (ec)
            {
                result = Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
                goto OnError;
            }

            // Bind to the provided interface address
            bindAddress = UDPAddress(bindAddr, port);
        }
        else
        {
            // Create an IPv4/IPv6 socket based on the server address type
            asio::ip::udp internet_protocol = (bindIPVersion == IPVersion::V4)
                ? asio::ip::udp::v4() : asio::ip::udp::v6();

            // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
            bindAddress = UDPAddress(internet_protocol, port);
        }

        // Open socket
        Socket->open(bindAddress.protocol(), ec);
        if (ec)
        {
            result = Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Set common socket options before bind
        result = SetUDPSocketOptions(
            *Socket,
            socketConfig->UDPSendBufferSizeBytes,
            socketConfig->UDPRecvBufferSizeBytes);
        if (result.IsFail()) {
            goto OnError;
        }

        // Bind socket
        Socket->bind(bindAddress, ec);
        if (ec)
        {
            result = Result("UDP socket bind failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Get local bound port
        const UDPAddress local_ep = Socket->local_endpoint(ec);
        if (ec)
        {
            result = Result("local_endpoint failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }
        LocalBoundPort = local_ep.port();

#ifdef TONK_DONT_FRAGMENT
        result = dontFragment(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_DONT_FRAGMENT

#ifdef TONK_IGNORE_ICMP_UNREACHABLE
        result = ignoreUnreachable(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_IGNORE_ICMP_UNREACHABLE

        // Allocate the first read buffer
        uint8_t* readBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
        if (!readBuffer)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        // Post the first read
        Deps.SocketRefCount->IncrementReferences();
        postNextRead(readBuffer);
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("UDPSocket::CreateSocket", "Exception!", ErrorType::Asio);
    }

OnError:
    if (result.IsFail())
    {
        Deps.Logger->Error("UDPSocket::Initialize failed: ", result.ToJson());
        CloseSocket();
    }
    return result;
}